

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_2> vkt::sr::anon_unknown_0::MatrixCaseUtils::inverse<2>(Matrix<float,_2,_2> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int col;
  long lVar5;
  float *pfVar6;
  Matrix<float,_2,_2> *retVal;
  float *in_RDI;
  long lVar7;
  bool bVar8;
  float fVar9;
  Matrix<float,_2,_2> MVar10;
  
  fVar1 = (mat->m_data).m_data[0].m_data[0];
  fVar2 = (mat->m_data).m_data[0].m_data[1];
  fVar3 = (mat->m_data).m_data[1].m_data[1];
  fVar4 = (mat->m_data).m_data[1].m_data[0];
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  lVar5 = 0;
  pfVar6 = in_RDI;
  do {
    lVar7 = 0;
    do {
      fVar9 = 1.0;
      if (lVar5 != lVar7) {
        fVar9 = 0.0;
      }
      pfVar6[lVar7 * 2] = fVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    pfVar6 = pfVar6 + 1;
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  MVar10.m_data.m_data[1].m_data[0] = fVar3 * fVar1 - fVar4 * fVar2;
  *in_RDI = (mat->m_data).m_data[1].m_data[1] / MVar10.m_data.m_data[1].m_data[0];
  in_RDI[2] = -fVar4 / MVar10.m_data.m_data[1].m_data[0];
  in_RDI[1] = -fVar2 / MVar10.m_data.m_data[1].m_data[0];
  MVar10.m_data.m_data[0].m_data[0] = fVar1 / MVar10.m_data.m_data[1].m_data[0];
  MVar10.m_data.m_data[0].m_data[1] = 0.0;
  in_RDI[3] = MVar10.m_data.m_data[0].m_data[0];
  MVar10.m_data.m_data[1].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar10.m_data.m_data;
}

Assistant:

tcu::Matrix<float, 2, 2> inverse<2> (const tcu::Matrix<float, 2, 2>& mat)
{
	const float					det		= determinant(mat);
	tcu::Matrix<float, 2, 2>	retVal;

	DE_ASSERT(det != 0.0f);

	retVal(0, 0) =  mat(1, 1) / det;
	retVal(0, 1) = -mat(0, 1) / det;
	retVal(1, 0) = -mat(1, 0) / det;
	retVal(1, 1) =  mat(0, 0) / det;

	return retVal;
}